

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

string * nlohmann::json_abi_v3_11_2::detail::
         serializer<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
         ::hex_bytes(string *__return_storage_ptr__,uint8_t byte)

{
  char cVar1;
  char *pcVar2;
  char *nibble_to_hex;
  allocator<char> local_13;
  undefined1 local_12;
  byte local_11;
  string *psStack_10;
  uint8_t byte_local;
  string *result;
  
  local_12 = 0;
  local_11 = byte;
  psStack_10 = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"FF",&local_13);
  std::allocator<char>::~allocator(&local_13);
  cVar1 = "0123456789ABCDEF"[local_11 >> 4];
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
  *pcVar2 = cVar1;
  cVar1 = "0123456789ABCDEF"[local_11 & 0xf];
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
  *pcVar2 = cVar1;
  return __return_storage_ptr__;
}

Assistant:

static std::string hex_bytes(std::uint8_t byte)
    {
        std::string result = "FF";
        constexpr const char* nibble_to_hex = "0123456789ABCDEF";
        result[0] = nibble_to_hex[byte / 16];
        result[1] = nibble_to_hex[byte % 16];
        return result;
    }